

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadCommand.cxx
# Opt level: O0

bool __thiscall cmCTestUploadCommand::CheckArgumentValue(cmCTestUploadCommand *this,string *arg)

{
  cmMakefile *this_00;
  bool bVar1;
  value_type pcVar2;
  reference ppcVar3;
  char *filename;
  ostream *poVar4;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream e;
  string *arg_local;
  cmCTestUploadCommand *this_local;
  
  if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 4) {
    pcVar2 = (value_type)std::__cxx11::string::c_str();
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,2);
    *ppcVar3 = pcVar2;
    this_local._7_1_ = true;
  }
  else if ((this->super_cmCTestHandlerCommand).ArgumentDoing == 3) {
    filename = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(filename);
    if (bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->Files,arg);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      poVar4 = std::operator<<((ostream *)local_1a8,"File \"");
      poVar4 = std::operator<<(poVar4,(string *)arg);
      poVar4 = std::operator<<(poVar4,"\" does not exist. Cannot submit ");
      std::operator<<(poVar4,"a non-existent file.");
      this_00 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 1;
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
    }
  }
  else {
    this_local._7_1_ =
         cmCTestHandlerCommand::CheckArgumentValue(&this->super_cmCTestHandlerCommand,arg);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestUploadCommand::CheckArgumentValue(std::string const& arg)
{
  if (this->ArgumentDoing == ArgumentDoingCaptureCMakeError) {
    this->Values[ct_CAPTURE_CMAKE_ERROR] = arg.c_str();
    return true;
  }
  if (this->ArgumentDoing == ArgumentDoingFiles) {
    if (cmSystemTools::FileExists(arg.c_str())) {
      this->Files.insert(arg);
      return true;
    }
    std::ostringstream e;
    e << "File \"" << arg << "\" does not exist. Cannot submit "
      << "a non-existent file.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    this->ArgumentDoing = ArgumentDoingError;
    return false;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentValue(arg);
}